

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * Japanese_item_name(int i)

{
  char **ppcVar1;
  
  ppcVar1 = &Japanese_items[0].name;
  while( true ) {
    if (((Jitem *)(ppcVar1 + -1))->item == 0) {
      return (char *)0x0;
    }
    if (((Jitem *)(ppcVar1 + -1))->item == i) break;
    ppcVar1 = ppcVar1 + 2;
  }
  return *ppcVar1;
}

Assistant:

static const char *Japanese_item_name(int i)
{
	const struct Jitem *j = Japanese_items;

	while (j->item) {
		if (i == j->item)
			return j->name;
		j++;
	}
	return NULL;
}